

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O0

full_frame * check_for_work(__cilkrts_worker *w)

{
  uint uVar1;
  uint uVar2;
  __cilkrts_worker *in_RDI;
  uint max_fails;
  full_frame *ff;
  full_frame *local_10;
  
  local_10 = pop_next_frame(in_RDI);
  if (local_10 == (full_frame *)0x0) {
    if ((in_RDI->l->type != WORKER_USER) && (in_RDI->l->team != (__cilkrts_worker *)0x0)) {
      __cilkrts_worker_lock((__cilkrts_worker *)0x116a6d);
      in_RDI->l->team = (__cilkrts_worker *)0x0;
      __cilkrts_worker_unlock((__cilkrts_worker *)0x116a8b);
    }
    if (in_RDI->l->frame_ff != (full_frame *)0x0) {
      __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                    ,0x6fc,"NULL == w->l->frame_ff");
    }
    random_steal(w);
    local_10 = pop_next_frame(in_RDI);
    if (local_10 == (full_frame *)0x0) {
      uVar1 = in_RDI->g->max_steal_failures;
      uVar2 = uVar1 * 2;
      if ((in_RDI->l->has_stolen == 0) && (in_RDI->l->steal_failure_count % uVar2 == uVar2 - 1)) {
        __cilkrts_idle();
      }
      else {
        __cilkrts_yield();
      }
      in_RDI->l->steal_failure_count = in_RDI->l->steal_failure_count + 1;
      if (uVar1 << 9 < in_RDI->l->steal_failure_count) {
        in_RDI->l->has_stolen = 0;
      }
    }
    else {
      in_RDI->l->steal_failure_count = 0;
      in_RDI->l->has_stolen = 1;
    }
  }
  return local_10;
}

Assistant:

static full_frame* check_for_work(__cilkrts_worker *w)
{
    full_frame *ff = NULL;
    ff = pop_next_frame(w);
    // If there is no work on the queue, try to steal some.
    if (NULL == ff) {
        START_INTERVAL(w, INTERVAL_STEALING) {
            if (w->l->type != WORKER_USER && w->l->team != NULL) {
                // At this point, the worker knows for certain that it has run
                // out of work.  Therefore, it loses its team affiliation.  User
                // workers never change teams, of course.
                __cilkrts_worker_lock(w);
                w->l->team = NULL;
                __cilkrts_worker_unlock(w);
            }

            // If we are about to do a random steal, we should have no
            // full frame...
            CILK_ASSERT(NULL == w->l->frame_ff);
            random_steal(w);
        } STOP_INTERVAL(w, INTERVAL_STEALING);

        // If the steal was successful, then the worker has populated its next
        // frame with the work to resume.
        ff = pop_next_frame(w);
        if (NULL == ff) {
            // Punish the worker for failing to steal.
            // No quantum for you!
            unsigned int max_fails = w->g->max_steal_failures << 1;
            if (w->l->has_stolen == 0 &&
                w->l->steal_failure_count % max_fails == max_fails - 1) {
                // Idle briefly if the worker has never stolen anything for
                // the given grace period
                __cilkrts_idle();
            } else {
                __cilkrts_yield();
            }
            w->l->steal_failure_count++;
            if (w->l->steal_failure_count > (max_fails << 8)) {
                // Reset the flag after certain amount of failures
                // - This will reduce cpu time in top-level synched regions
                // - max_fails can be controlled by user (CILK_STEAL_FAILURES)
                w->l->has_stolen = 0;
            }
        } else {
            // Reset steal_failure_count since there is obviously still work to
            // be done.
            w->l->steal_failure_count = 0;
            w->l->has_stolen = 1;
        }
    }
    return ff;
}